

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeHolder::resolveUnresolvedLinks(CodeHolder *this)

{
  long *plVar1;
  size_type *psVar2;
  uint uVar3;
  size_type sVar4;
  long lVar5;
  Error EVar6;
  ulong extraout_RAX;
  size_type *psVar7;
  long lVar8;
  ulong uVar9;
  uint8_t *puVar10;
  Slot *pSVar11;
  uint extraout_EDX;
  uint extraout_EDX_00;
  Slot *pSVar12;
  bool bVar13;
  uint8_t *in_RSI;
  CodeHolder *dst;
  CodeHolder *pCVar14;
  ZoneAllocator *allocator;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 unaff_R12;
  undefined8 uVar19;
  long lVar20;
  Slot *pSVar21;
  undefined8 unaff_R14;
  bool bVar22;
  size_t sStack_b0;
  uint8_t *puStack_a8;
  undefined8 uStack_a0;
  CodeHolder *pCStack_98;
  Slot *pSStack_90;
  ulong uStack_88;
  undefined8 uStack_80;
  CodeHolder *pCStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  Slot *pSStack_58;
  Slot *pSStack_50;
  long *local_48;
  long *local_40;
  uint8_t *local_38;
  
  uVar19 = 0;
  if ((this->_unresolvedLinkCount != 0) &&
     (uVar9 = (ulong)(this->_labelEntries).super_ZoneVectorBase._size, uVar9 != 0)) {
    local_40 = (long *)(this->_labelEntries).super_ZoneVectorBase._data;
    local_48 = local_40 + uVar9;
    uVar19 = 0;
    dst = this;
    do {
      lVar20 = *local_40;
      if ((*(long *)(lVar20 + 0x20) != 0) &&
         (pSVar12 = *(Slot **)(lVar20 + 0x28), pSVar12 != (Slot *)0x0)) {
        pSVar21 = (Slot *)(lVar20 + 0x28);
        uVar9 = *(ulong *)(*(long *)(lVar20 + 0x20) + 0x10);
        bVar22 = CARRY8(uVar9,*(ulong *)(lVar20 + 0x18));
        puVar10 = (uint8_t *)(uVar9 + *(ulong *)(lVar20 + 0x18));
        unaff_R14 = CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar22);
        local_38 = puVar10;
        do {
          if (*(int *)((long)&pSVar12[1].next + 4) == -1) {
            uVar3 = *(uint *)&pSVar12[1].next;
            if (uVar3 < (this->_sections).super_ZoneVectorBase._size) {
              if ((this->_sections).super_ZoneVectorBase._size <= uVar3) goto LAB_00115333;
              puVar10 = (uint8_t *)(this->_sections).super_ZoneVectorBase._data;
              lVar20 = *(long *)(puVar10 + (ulong)uVar3 * 8);
              dst = (CodeHolder *)pSVar12[2].next;
              if (*(CodeHolder **)(lVar20 + 0x50) <= dst) goto LAB_00115338;
              puVar10 = &(dst->_environment)._arch + *(ulong *)(lVar20 + 0x10);
              bVar13 = CARRY8(*(ulong *)(lVar20 + 0x10),(ulong)dst) || bVar22;
              in_RSI = (uint8_t *)CONCAT71((int7)((ulong)in_RSI >> 8),bVar13);
              unaff_R12 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
              if (bVar13) {
LAB_001152e6:
                uVar19 = 0x31;
LAB_001152ef:
                if ((char)unaff_R12 != '\0') goto LAB_001152f7;
                goto LAB_001152fd;
              }
              in_RSI = (uint8_t *)(ulong)*(byte *)((long)&pSVar12[4].next + 3);
              if ((undefined8 *)((long)*(CodeHolder **)(lVar20 + 0x50) - (long)dst) < in_RSI)
              goto LAB_0011533d;
              in_RSI = local_38 + ((long)&(pSVar12[3].next)->next - (long)puVar10);
              dst = (CodeHolder *)(&(dst->_environment)._arch + *(long *)(lVar20 + 0x48));
              pSStack_50 = (Slot *)0x1152bd;
              bVar13 = CodeWriterUtils::writeOffset
                                 (dst,(int64_t)in_RSI,(OffsetFormat *)(pSVar12 + 4));
              if (!bVar13) goto LAB_001152e6;
              pSVar11 = pSVar12->next;
              pSVar21->next = pSVar11;
              this->_unresolvedLinkCount = this->_unresolvedLinkCount - 1;
              if ((this->_allocator)._zone != (Zone *)0x0) {
                puVar10 = (uint8_t *)(this->_allocator)._slots[1];
                pSVar12->next = (Slot *)puVar10;
                (this->_allocator)._slots[1] = pSVar12;
                unaff_R12 = 0;
                pSVar12 = pSVar11;
                goto LAB_001152ef;
              }
            }
            else {
              pSStack_50 = (Slot *)0x115333;
              resolveUnresolvedLinks();
LAB_00115333:
              pSStack_50 = (Slot *)0x115338;
              resolveUnresolvedLinks();
LAB_00115338:
              pSStack_50 = (Slot *)0x11533d;
              resolveUnresolvedLinks();
LAB_0011533d:
              pSStack_50 = (Slot *)0x115342;
              resolveUnresolvedLinks();
            }
            pSStack_50 = (Slot *)0x115347;
            resolveUnresolvedLinks();
            if (*(uint *)(in_RSI + 4) < (dst->_labelEntries).super_ZoneVectorBase._size) {
              lVar20 = *(long *)((long)(dst->_labelEntries).super_ZoneVectorBase._data +
                                (ulong)*(uint *)(in_RSI + 4) * 8);
            }
            else {
              lVar20 = 0;
            }
            if (lVar20 == 0) goto LAB_001154da;
            uVar3 = (dst->_sections).super_ZoneVectorBase._size;
            if (uVar3 < extraout_EDX) {
              uStack_80 = 0x1400000000;
              goto LAB_001154b3;
            }
            if (*(long *)(lVar20 + 0x20) != 0) {
              uStack_80 = 0xe00000000;
              goto LAB_001154b3;
            }
            pCStack_78 = this;
            uStack_70 = unaff_R12;
            uStack_68 = uVar19;
            uStack_60 = unaff_R14;
            pSStack_58 = pSVar12;
            pSStack_50 = pSVar21;
            if (extraout_EDX < uVar3) {
              lVar15 = *(long *)((long)(dst->_sections).super_ZoneVectorBase._data +
                                (ulong)extraout_EDX * 8);
              *(long *)(lVar20 + 0x20) = lVar15;
              *(uint8_t **)(lVar20 + 0x18) = puVar10;
              if (*(Slot **)(lVar20 + 0x28) == (Slot *)0x0) {
                uStack_80 = 0;
                goto LAB_001154b3;
              }
              pSVar21 = (Slot *)(lVar20 + 0x28);
              uStack_80 = extraout_RAX & 0xffffffff;
              pSVar12 = *(Slot **)(lVar20 + 0x28);
              goto LAB_001153d4;
            }
            uStack_88 = 0x1154fd;
            pCVar14 = dst;
            bindLabel();
            allocator = &pCVar14->_allocator;
            EVar6 = 0;
            puStack_a8 = puVar10;
            uStack_a0 = unaff_R12;
            pCStack_98 = dst;
            pSStack_90 = pSVar12;
            uStack_88 = (ulong)extraout_EDX;
            if ((pCVar14->_relocations).super_ZoneVectorBase._capacity ==
                (pCVar14->_relocations).super_ZoneVectorBase._size) {
              EVar6 = ZoneVectorBase::_grow
                                (&(pCVar14->_relocations).super_ZoneVectorBase,allocator,8,1);
            }
            if (EVar6 == 0) {
              sVar4 = (pCVar14->_relocations).super_ZoneVectorBase._size;
              if (sVar4 == 0xffffffff) {
                EVar6 = 0x17;
              }
              else {
                if (allocator->_zone == (Zone *)0x0) {
                  newRelocEntry();
                }
                else {
                  psVar7 = (size_type *)ZoneAllocator::_allocZeroed(allocator,0x28,&sStack_b0);
                  if (psVar7 != (size_type *)0x0) {
                    *psVar7 = sVar4;
                    psVar7[1] = extraout_EDX_00 & 0xff;
                    psVar7[4] = 0xffffffff;
                    psVar7[5] = 0xffffffff;
                    uVar3 = (pCVar14->_relocations).super_ZoneVectorBase._size;
                    if (uVar3 < (pCVar14->_relocations).super_ZoneVectorBase._capacity) {
                      *(size_type **)
                       ((long)(pCVar14->_relocations).super_ZoneVectorBase._data + (ulong)uVar3 * 8)
                           = psVar7;
                      psVar2 = &(pCVar14->_relocations).super_ZoneVectorBase._size;
                      *psVar2 = *psVar2 + 1;
                      *(size_type **)in_RSI = psVar7;
                      return 0;
                    }
                    newRelocEntry();
                    lVar20 = *(long *)(allocator + 2);
                    uVar9 = (ulong)*(uint32_t *)((long)(allocator + 2) + 8);
                    bVar22 = uVar9 == 0;
                    if (bVar22) goto LAB_00115645;
                    lVar15 = 0;
                    uVar18 = 0;
                    goto LAB_001155ef;
                  }
                }
                EVar6 = 1;
              }
            }
            return EVar6;
          }
LAB_001152f7:
          pSVar21 = pSVar12;
          pSVar12 = pSVar21->next;
LAB_001152fd:
        } while (pSVar12 != (Slot *)0x0);
      }
      local_40 = local_40 + 1;
    } while (local_40 != local_48);
  }
  return (Error)uVar19;
LAB_001153d4:
  uVar3 = *(uint *)((long)&pSVar12[1].next + 4);
  if ((ulong)uVar3 != 0xffffffff) {
    if (uVar3 < (dst->_relocations).super_ZoneVectorBase._size) {
      lVar20 = *(long *)((long)(dst->_relocations).super_ZoneVectorBase._data + (ulong)uVar3 * 8);
      plVar1 = (long *)(lVar20 + 0x20);
      *plVar1 = (long)(puVar10 + *plVar1);
      *(uint *)(lVar20 + 0x14) = extraout_EDX;
LAB_001153fd:
      pSVar11 = pSVar12->next;
      pSVar21->next = pSVar11;
      dst->_unresolvedLinkCount = dst->_unresolvedLinkCount - 1;
      if ((dst->_allocator)._zone != (Zone *)0x0) {
        pSVar12->next = (dst->_allocator)._slots[1];
        (dst->_allocator)._slots[1] = pSVar12;
        goto LAB_0011549d;
      }
      uStack_88 = 0x1154cb;
      bindLabel();
    }
    uStack_88 = 0x1154d0;
    bindLabel();
LAB_001154d0:
    uStack_88 = 0x1154d5;
    bindLabel();
LAB_001154d5:
    uStack_88 = 0x1154da;
    bindLabel();
LAB_001154da:
    uStack_80 = 0xc00000000;
LAB_001154b3:
    return uStack_80._4_4_;
  }
  if (*(uint *)&pSVar12[1].next == extraout_EDX) {
    pSVar11 = pSVar12[2].next;
    if (*(Slot **)(lVar15 + 0x50) <= pSVar11) goto LAB_001154d0;
    if ((ulong)*(byte *)((long)&pSVar12[4].next + 2) <=
        (ulong)((long)*(Slot **)(lVar15 + 0x50) - (long)pSVar11)) {
      uStack_88 = 0x115469;
      bVar22 = CodeWriterUtils::writeOffset
                         ((void *)((long)&pSVar11->next + *(long *)(lVar15 + 0x48)),
                          ((long)puVar10 - (long)pSVar11) + (long)pSVar12[3].next,
                          (OffsetFormat *)(pSVar12 + 4));
      if (bVar22) goto LAB_001153fd;
      pSVar11 = pSVar12->next;
      uStack_80 = CONCAT44(0x31,(undefined4)uStack_80);
      pSVar21 = pSVar12;
      goto LAB_0011549d;
    }
    goto LAB_001154d5;
  }
  pSVar11 = pSVar12->next;
  pSVar21 = pSVar12;
LAB_0011549d:
  pSVar12 = pSVar11;
  if (pSVar11 == (Slot *)0x0) goto LAB_001154b3;
  goto LAB_001153d4;
  while( true ) {
    lVar15 = lVar15 + 8;
    bVar22 = uVar9 * 8 - lVar15 == 0;
    if (bVar22) break;
LAB_001155ef:
    lVar8 = *(long *)(lVar20 + lVar15);
    uVar16 = *(ulong *)(lVar8 + 0x50);
    if (*(ulong *)(lVar8 + 0x50) < *(ulong *)(lVar8 + 0x18)) {
      uVar16 = *(ulong *)(lVar8 + 0x18);
    }
    if (uVar16 == 0) {
      bVar13 = true;
    }
    else {
      uVar17 = -(ulong)*(uint *)(lVar8 + 8) & (uVar18 + *(uint *)(lVar8 + 8)) - 1;
      if (uVar17 < uVar18) {
        bVar13 = false;
      }
      else {
        uVar18 = uVar17 + uVar16;
        bVar13 = !CARRY8(uVar17,uVar16);
      }
    }
    if (!bVar13) break;
  }
LAB_00115645:
  EVar6 = 9;
  if (bVar22) {
    if (uVar9 != 0) {
      lVar8 = 0;
      uVar18 = 0;
      lVar15 = 0;
      do {
        lVar5 = *(long *)(lVar20 + lVar8);
        uVar16 = *(ulong *)(lVar5 + 0x50);
        if (*(ulong *)(lVar5 + 0x50) < *(ulong *)(lVar5 + 0x18)) {
          uVar16 = *(ulong *)(lVar5 + 0x18);
        }
        if (uVar16 != 0) {
          uVar18 = -(ulong)*(uint *)(lVar5 + 8) & (uVar18 + *(uint *)(lVar5 + 8)) - 1;
        }
        *(ulong *)(lVar5 + 0x10) = uVar18;
        if (lVar15 != 0) {
          *(ulong *)(lVar15 + 0x18) = uVar18 - *(long *)(lVar15 + 0x10);
        }
        uVar18 = uVar18 + uVar16;
        lVar8 = lVar8 + 8;
        lVar15 = lVar5;
      } while (uVar9 << 3 != lVar8);
    }
    EVar6 = 0;
  }
  return EVar6;
}

Assistant:

ASMJIT_API Error CodeHolder::resolveUnresolvedLinks() noexcept {
  if (!hasUnresolvedLinks())
    return kErrorOk;

  Error err = kErrorOk;
  for (LabelEntry* le : labelEntries()) {
    if (!le->isBound())
      continue;

    LabelLinkIterator link(le);
    if (link) {
      Support::FastUInt8 of = 0;
      Section* toSection = le->section();
      uint64_t toOffset = Support::addOverflow(toSection->offset(), le->offset(), &of);

      do {
        uint32_t linkSectionId = link->sectionId;
        if (link->relocId == Globals::kInvalidId) {
          Section* fromSection = sectionById(linkSectionId);
          size_t linkOffset = link->offset;

          CodeBuffer& buf = _sections[linkSectionId]->buffer();
          ASMJIT_ASSERT(linkOffset < buf.size());

          // Calculate the offset relative to the start of the virtual base.
          Support::FastUInt8 localOF = of;
          uint64_t fromOffset = Support::addOverflow<uint64_t>(fromSection->offset(), linkOffset, &localOF);
          int64_t displacement = int64_t(toOffset - fromOffset + uint64_t(int64_t(link->rel)));

          if (!localOF) {
            ASMJIT_ASSERT(size_t(linkOffset) < buf.size());
            ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.valueSize());

            // Overwrite a real displacement in the CodeBuffer.
            if (CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
              link.resolveAndNext(this);
              continue;
            }
          }

          err = DebugUtils::errored(kErrorInvalidDisplacement);
          // Falls through to `link.next()`.
        }

        link.next();
      } while (link);
    }
  }

  return err;
}